

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O0

int Bmc_EcoSolve(sat_solver *pSat,int Root,Vec_Int_t *vVars)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  sat_solver *psVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int local_60;
  int nVars;
  int pLits [2];
  int RetValue;
  int nIter;
  int *pFinal;
  uint local_40;
  int nFinal;
  int iVar;
  int Div;
  int i;
  int status;
  Vec_Int_t *vLits;
  Vec_Int_t *pVStack_20;
  int nBTLimit;
  Vec_Int_t *vVars_local;
  sat_solver *psStack_10;
  int Root_local;
  sat_solver *pSat_local;
  
  vLits._4_4_ = 1000000;
  pVStack_20 = vVars;
  vVars_local._4_4_ = Root;
  psStack_10 = pSat;
  iVar4 = Vec_IntSize(vVars);
  _i = Vec_IntAlloc(iVar4);
  pLits[1] = 0;
  pLits[0] = 0;
  iVar4 = sat_solver_nvars(psStack_10);
  sat_solver_setnvars(psStack_10,iVar4 + 1);
  local_60 = Abc_Var2Lit(vVars_local._4_4_,0);
  nVars = Abc_Var2Lit(iVar4,0);
  do {
    Div = sat_solver_solve(psStack_10,&local_60,pLits,(long)vLits._4_4_,0,0,0);
    if (Div == 0) {
      pLits[0] = -1;
LAB_006bcf53:
      Vec_IntFree(_i);
      return pLits[0];
    }
    if (Div == -1) {
      pLits[0] = 1;
      goto LAB_006bcf53;
    }
    if (Div != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0x9b,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
    }
    Vec_IntClear(_i);
    pVVar2 = _i;
    iVar4 = Abc_LitNot(local_60);
    Vec_IntPush(pVVar2,iVar4);
    for (iVar = 0; iVar4 = iVar, iVar5 = Vec_IntSize(pVStack_20), psVar3 = psStack_10, iVar4 < iVar5
        ; iVar = iVar + 1) {
      nFinal = Vec_IntEntry(pVStack_20,iVar);
      pVVar2 = _i;
      iVar4 = sat_solver_var_literal(psStack_10,nFinal);
      Vec_IntPush(pVVar2,iVar4);
    }
    piVar6 = Vec_IntArray(_i);
    piVar7 = Vec_IntArray(_i);
    iVar4 = Vec_IntSize(_i);
    Div = sat_solver_solve(psVar3,piVar6,piVar7 + iVar4,(long)vLits._4_4_,0,0,0);
    if (Div == 0) {
      pLits[0] = -1;
      goto LAB_006bcf53;
    }
    if (Div == 1) goto LAB_006bcf53;
    if (Div != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xa7,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
    }
    pFinal._4_4_ = sat_solver_final(psStack_10,(int **)&RetValue);
    Vec_IntClear(_i);
    pVVar2 = _i;
    iVar4 = Abc_LitNot(nVars);
    Vec_IntPush(pVVar2,iVar4);
    printf("Cube %d : ",(ulong)(uint)pLits[1]);
    for (iVar = 0; iVar < pFinal._4_4_; iVar = iVar + 1) {
      if (_RetValue[iVar] != local_60) {
        Vec_IntPush(_i,_RetValue[iVar]);
        pVVar2 = pVStack_20;
        iVar4 = Abc_Lit2Var(_RetValue[iVar]);
        local_40 = Vec_IntFind(pVVar2,iVar4);
        if ((int)local_40 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                        ,0xb2,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
        }
        iVar4 = Abc_LitIsCompl(_RetValue[iVar]);
        pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
        if (iVar4 != 0) {
          pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
        }
        printf("%s%d ",pcVar1 + 0x4a,(ulong)local_40);
      }
    }
    printf("\n");
    psVar3 = psStack_10;
    piVar6 = Vec_IntArray(_i);
    piVar7 = Vec_IntArray(_i);
    iVar4 = Vec_IntSize(_i);
    Div = sat_solver_addclause(psVar3,piVar6,piVar7 + iVar4);
    if (Div == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xb7,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
    }
    pLits[1] = pLits[1] + 1;
  } while( true );
}

Assistant:

int Bmc_EcoSolve( sat_solver * pSat, int Root, Vec_Int_t * vVars )
{
    int nBTLimit = 1000000;
    Vec_Int_t * vLits   = Vec_IntAlloc( Vec_IntSize(vVars) );
    int status, i, Div, iVar, nFinal, * pFinal, nIter = 0, RetValue = 0;
    int pLits[2], nVars = sat_solver_nvars( pSat );
    sat_solver_setnvars( pSat, nVars + 1 );
    pLits[0] = Abc_Var2Lit( Root, 0 );  // F = 1
    pLits[1] = Abc_Var2Lit( nVars, 0 ); // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            { RetValue = -1; break; }
        if ( status == l_False )
            { RetValue = 1; break; }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( vVars, Div, i )
            Vec_IntPush( vLits, sat_solver_var_literal(pSat, Div) );
        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            { RetValue = -1; break; }
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        printf( "Cube %d : ", nIter );
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( vLits, pFinal[i] );
            iVar = Vec_IntFind( vVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            printf( "%s%d ", Abc_LitIsCompl(pFinal[i]) ? "+":"-", iVar );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( status );
        nIter++;
    }
//    assert( status == l_True );
    Vec_IntFree( vLits );
    return RetValue;
}